

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangular.cpp
# Opt level: O0

void calc<double>(string *Ja_in,string *Jb_in,string *Jc_in)

{
  _Setprecision _Var1;
  ostream *poVar2;
  void *pvVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double unaff_retaddr;
  double in_stack_00000008;
  double tc;
  real_t_conflict Jc;
  real_t_conflict Jb;
  real_t_conflict Ja;
  
  dVar4 = convert<double>((string *)0x108cdd);
  dVar5 = convert<double>((string *)0x108ced);
  dVar6 = convert<double>((string *)0x108cfd);
  dVar7 = ising::tc::triangular<double>(tc,in_stack_00000008,unaff_retaddr);
  poVar2 = (ostream *)std::ostream::operator<<(&std::cout,std::scientific);
  _Var1 = std::setprecision(0xf);
  poVar2 = std::operator<<(poVar2,_Var1);
  poVar2 = std::operator<<(poVar2,"# lattice: triangular\n");
  poVar2 = std::operator<<(poVar2,"# precision: ");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,0xf);
  poVar2 = (ostream *)std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,"# Ja Jb Jc Tc 1/Tc");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = (ostream *)std::ostream::operator<<(pvVar3,dVar4);
  poVar2 = std::operator<<(poVar2,' ');
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,dVar5);
  poVar2 = std::operator<<(poVar2,' ');
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,dVar6);
  poVar2 = std::operator<<(poVar2,' ');
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,dVar7);
  poVar2 = std::operator<<(poVar2,' ');
  pvVar3 = (void *)std::ostream::operator<<(poVar2,1.0 / dVar7);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void calc(const std::string& Ja_in, const std::string& Jb_in, const std::string& Jc_in) {
  typedef T real_t;
  real_t Ja = convert<real_t>(Ja_in);
  real_t Jb = convert<real_t>(Jb_in);
  real_t Jc = convert<real_t>(Jc_in);
  auto tc = ising::tc::triangular(Ja, Jb, Jc);
  std::cout << std::scientific << std::setprecision(std::numeric_limits<real_t>::digits10)
            << "# lattice: triangular\n"
            << "# precision: " << std::numeric_limits<real_t>::digits10 << std::endl
            << "# Ja Jb Jc Tc 1/Tc" << std::endl
            << Ja << ' ' << Jb << ' ' << Jc << ' ' << tc << ' ' << (1 / tc) << std::endl;
}